

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O0

void __thiscall Callback::Emitter::SignalActivation::~SignalActivation(SignalActivation *this)

{
  SignalActivation *pSVar1;
  bool bVar2;
  int iVar3;
  Iterator *pIVar4;
  Slot *pSVar5;
  undefined4 extraout_var;
  Iterator local_20;
  Iterator end;
  Iterator i;
  SignalActivation *this_local;
  
  if ((this->invalidated & 1U) == 0) {
    if (((this->data != (SignalData *)0x0) &&
        (pSVar1 = this->next, this->data->activation = pSVar1, pSVar1 == (SignalActivation *)0x0))
       && ((this->data->dirty & 1U) != 0)) {
      pIVar4 = List<Callback::Emitter::Slot>::begin(&this->data->slots);
      end.item = pIVar4->item;
      pIVar4 = List<Callback::Emitter::Slot>::end(&this->data->slots);
      local_20.item = pIVar4->item;
      do {
        while( true ) {
          bVar2 = List<Callback::Emitter::Slot>::Iterator::operator!=(&end,&local_20);
          if (!bVar2) {
            this->data->dirty = false;
            return;
          }
          pSVar5 = List<Callback::Emitter::Slot>::Iterator::operator->(&end);
          if (pSVar5->state != connecting) break;
          pSVar5 = List<Callback::Emitter::Slot>::Iterator::operator->(&end);
          pSVar5->state = connected;
LAB_001071ea:
          List<Callback::Emitter::Slot>::Iterator::operator++(&end);
        }
        if (pSVar5->state != disconnected) goto LAB_001071ea;
        iVar3 = List<Callback::Emitter::Slot>::remove(&this->data->slots,(char *)&end);
        end.item = (Item *)CONCAT44(extraout_var,iVar3);
      } while( true );
    }
  }
  else if (this->next != (SignalActivation *)0x0) {
    this->next->invalidated = true;
  }
  return;
}

Assistant:

Callback::Emitter::SignalActivation::~SignalActivation()
{
  if(!invalidated)
  {
    if(data && !(data->activation = next) && data->dirty)
    {
      for(List<Slot>::Iterator i = data->slots.begin(), end = data->slots.end(); i != end;)
        switch(i->state)
        {
        case Slot::disconnected:
          i = data->slots.remove(i);
          break;
        case Slot::connecting:
          i->state = Slot::connected;
        default:
          ++i;
        }
      data->dirty = false;
    }
  }
  else if(next)
    next->invalidated = true;
}